

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

Status cmSystemTools::CreateLink(string *origName,string *newName)

{
  string *b;
  bool bVar1;
  string local_60;
  string local_40;
  string *local_20;
  string *newName_local;
  string *origName_local;
  Status status;
  
  local_20 = newName;
  newName_local = origName;
  origName_local = (string *)CreateLinkQuietly(origName,newName);
  bVar1 = cmsys::Status::operator_cast_to_bool((Status *)&origName_local);
  b = local_20;
  if (!bVar1) {
    cmsys::Status::GetString_abi_cxx11_(&local_60,(Status *)&origName_local);
    cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string>
              (&local_40,(char (*) [24])"failed to create link \'",b,(char (*) [4])0x114ebd5,
               &local_60);
    Error(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return (Status)origName_local;
}

Assistant:

cmsys::Status cmSystemTools::CreateLink(std::string const& origName,
                                        std::string const& newName)
{
  cmsys::Status status = cmSystemTools::CreateLinkQuietly(origName, newName);
  if (!status) {
    cmSystemTools::Error(
      cmStrCat("failed to create link '", newName, "': ", status.GetString()));
  }
  return status;
}